

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  float *pfVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  float fVar11;
  uint c;
  uint local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float *local_38;
  
  fVar11 = wrap_width / scale;
  local_38 = &this->FallbackAdvanceX;
  bVar10 = true;
  local_3c = 0.0;
  pcVar8 = (char *)0x0;
  local_40 = 0.0;
  local_44 = 0.0;
  pcVar5 = text;
  local_48 = fVar11;
  do {
    if (text_end <= text) {
      return text;
    }
    local_4c = (uint)*text;
    lVar3 = 1;
    if (*text < '\0') {
      iVar2 = ImTextCharFromUtf8(&local_4c,text,text_end);
      lVar3 = (long)iVar2;
      fVar11 = local_48;
    }
    uVar6 = (ulong)local_4c;
    bVar1 = true;
    pcVar9 = pcVar5;
    if (uVar6 != 0) {
      pcVar4 = text + lVar3;
      if (local_4c < 0x20) {
        if (uVar6 != 10) {
          if (local_4c != 0xd) goto LAB_0013561d;
          goto LAB_001356d3;
        }
        bVar10 = true;
        local_3c = 0.0;
        bVar1 = false;
        local_40 = 0.0;
        local_44 = 0.0;
        text = pcVar4;
      }
      else {
LAB_0013561d:
        pfVar7 = (this->IndexAdvanceX).Data + uVar6;
        if ((this->IndexAdvanceX).Size <= (int)local_4c) {
          pfVar7 = local_38;
        }
        if (((uVar6 == 9) || (local_4c == 0x20)) || (local_4c == 0x3000)) {
          if (bVar10) {
            local_3c = local_3c + local_44;
          }
          if (bVar10) {
            pcVar9 = text;
            local_44 = 0.0;
          }
          local_44 = local_44 + *pfVar7;
          bVar10 = false;
        }
        else {
          local_40 = local_40 + *pfVar7;
          pcVar9 = pcVar4;
          if (!bVar10) {
            local_3c = local_3c + local_44 + local_40;
            local_40 = 0.0;
            local_44 = 0.0;
            pcVar8 = pcVar5;
            pcVar9 = pcVar5;
          }
          if ((local_4c < 0x40) && ((0x8800500200000000U >> (uVar6 & 0x3f) & 1) != 0)) {
            bVar10 = false;
          }
          else {
            bVar10 = local_4c != 0x22;
          }
        }
        if (fVar11 < local_3c + local_40) {
          pcVar5 = pcVar8;
          if (pcVar8 == (char *)0x0) {
            pcVar5 = pcVar9;
          }
          if (local_40 < fVar11) {
            text = pcVar5;
          }
        }
        else {
LAB_001356d3:
          bVar1 = false;
          text = pcVar4;
        }
      }
    }
    pcVar5 = pcVar9;
    if (bVar1) {
      return text;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // Simple word-wrapping for English, not full-featured. Please submit failing cases!
    // FIXME: Much possible improvements (don't cut things like "word !", "word!!!" but cut within "word,,,,", more sensible support for punctuations, support for Unicode punctuations, etc.)

    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"

    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX);
        if (ImCharIsBlankW(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = !(c == '.' || c == ',' || c == ';' || c == '!' || c == '?' || c == '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width > wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    return s;
}